

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathFunction xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  xmlXPathFunction p_Var1;
  
  if (name != (xmlChar *)0x0 && ctxt != (xmlXPathContextPtr)0x0) {
    if ((ctxt->funcLookupFunc != (xmlXPathFuncLookupFunc)0x0) &&
       (p_Var1 = (*ctxt->funcLookupFunc)(ctxt->funcLookupData,name,ns_uri),
       p_Var1 != (xmlXPathFunction)0x0)) {
      return p_Var1;
    }
    if (ctxt->funcHash != (xmlHashTablePtr)0x0) {
      p_Var1 = (xmlXPathFunction)xmlHashLookup2(ctxt->funcHash,name,ns_uri);
      return p_Var1;
    }
  }
  return (xmlXPathFunction)0x0;
}

Assistant:

xmlXPathFunction
xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    xmlXPathFunction ret;

    if (ctxt == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    if (ctxt->funcLookupFunc != NULL) {
	xmlXPathFuncLookupFunc f;

	f = ctxt->funcLookupFunc;
	ret = f(ctxt->funcLookupData, name, ns_uri);
	if (ret != NULL)
	    return(ret);
    }

    if (ctxt->funcHash == NULL)
	return(NULL);

XML_IGNORE_FPTR_CAST_WARNINGS
    ret = (xmlXPathFunction) xmlHashLookup2(ctxt->funcHash, name, ns_uri);
XML_POP_WARNINGS
    return(ret);
}